

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_parse_serverhello_tlsext(SSL_HANDSHAKE *hs,CBS *cbs)

{
  ssl_session_st *psVar1;
  uchar *puVar2;
  undefined8 __src;
  undefined8 __n;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint16_t *puVar6;
  byte bVar7;
  uint i;
  long lVar8;
  ulong uVar9;
  uint desc;
  SSL *ssl;
  size_t in_R8;
  uint uVar10;
  ptrdiff_t _Num;
  undefined **ppuVar11;
  bool bVar12;
  Span<const_unsigned_char> protocol;
  uint16_t type;
  uint8_t alert;
  CBS extensions;
  CBS extension;
  uint16_t local_6c;
  byte local_69;
  SSL *local_68;
  uint local_5c;
  undefined1 local_58 [40];
  
  ssl = hs->ssl;
  local_58._0_8_ = cbs->data;
  local_58._8_8_ = cbs->len;
  bVar3 = tls1_check_duplicate_extensions((CBS *)local_58);
  bVar12 = false;
  if (bVar3) {
    desc = 0x32;
    uVar10 = 0;
    local_68 = ssl;
    do {
      if ((SSL_CONFIG *)local_58._8_8_ == (SSL_CONFIG *)0x0) {
        ppuVar11 = &PTR_ext_sni_parse_serverhello_002d9390;
        bVar12 = false;
        uVar9 = 0;
        goto LAB_0013af88;
      }
      iVar5 = CBS_get_u16((CBS *)local_58,&local_6c);
      if ((iVar5 == 0) ||
         (iVar5 = CBS_get_u16_length_prefixed((CBS *)local_58,(CBS *)(local_58 + 0x18)), iVar5 == 0)
         ) {
        cVar4 = '\0';
        desc = 0x32;
      }
      else {
        puVar6 = &kExtensions;
        lVar8 = 0;
        do {
          if (*puVar6 == local_6c) {
            local_5c = (uint)lVar8;
            goto LAB_0013ae5e;
          }
          lVar8 = lVar8 + 1;
          puVar6 = puVar6 + 0x14;
        } while (lVar8 != 0x1c);
        puVar6 = (uint16_t *)0x0;
LAB_0013ae5e:
        if (puVar6 == (uint16_t *)0x0) {
          cVar4 = '\0';
          in_R8 = 0x1022;
          ERR_put_error(0x10,0,0xde,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x1022);
          ERR_add_error_dataf("extension %u");
          desc = 0x6e;
        }
        else {
          bVar7 = (byte)local_5c;
          if (((hs->extensions).sent >> (local_5c & 0x1f) & 1) == 0) {
            cVar4 = '\0';
            in_R8 = 0x102d;
            ERR_put_error(0x10,0,0xde,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0x102d);
            ERR_add_error_dataf("extension %u");
            desc = 0x6e;
          }
          else {
            local_69 = 0x32;
            cVar4 = (**(code **)(puVar6 + 8))(hs,&local_69,local_58 + 0x18);
            if (cVar4 == '\0') {
              in_R8 = 0x1037;
              ERR_put_error(0x10,0,0x95,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                            ,0x1037);
              ERR_add_error_dataf("extension %u");
              desc = (uint)local_69;
            }
            uVar10 = uVar10 | 1 << (bVar7 & 0x1f);
          }
        }
      }
    } while (cVar4 != '\0');
    bVar12 = false;
    ssl = local_68;
  }
  else {
    desc = 0x32;
  }
  goto LAB_0013affe;
LAB_0013af88:
  do {
    if ((uVar10 >> ((uint)uVar9 & 0x1f) & 1) == 0) {
      local_58[0x18] = 0x32;
      cVar4 = (*(code *)*ppuVar11)(hs,local_58 + 0x18,0);
      if (cVar4 == '\0') {
        in_R8 = 0x1044;
        ERR_put_error(0x10,0,0xa4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x1044);
        ERR_add_error_dataf("extension %u");
        desc = (uint)local_58[0x18];
        ssl = local_68;
        break;
      }
    }
    bVar12 = 0x1a < uVar9;
    uVar9 = uVar9 + 1;
    ppuVar11 = ppuVar11 + 5;
    ssl = local_68;
  } while (uVar9 != 0x1c);
LAB_0013affe:
  if (bVar12) {
    psVar1 = (hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    if (psVar1 == (ssl_session_st *)0x0) {
      return true;
    }
    if ((psVar1->field_0x1b8 & 0x40) == 0) {
      return true;
    }
    ssl = hs->ssl;
    puVar2 = (uchar *)(ssl->s3->alpn_selected).size_;
    if (puVar2 == (uchar *)0x0) {
      ERR_put_error(0x10,0,0x134,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1070);
      ssl_send_alert(ssl,2,0x2f);
      return false;
    }
    local_58._0_8_ = (SSL *)0x0;
    local_58._8_8_ = (SSL_CONFIG *)0x0;
    protocol.size_ = in_R8;
    protocol.data_ = puVar2;
    bVar3 = ssl_get_local_application_settings
                      ((bssl *)hs,(SSL_HANDSHAKE *)local_58,
                       (Span<const_unsigned_char> *)(ssl->s3->alpn_selected).data_,protocol);
    __n = local_58._8_8_;
    __src = local_58._0_8_;
    if (bVar3) {
      bVar3 = Array<unsigned_char>::InitUninitialized
                        (&psVar1->local_application_settings,local_58._8_8_);
      if ((SSL_CONFIG *)__n != (SSL_CONFIG *)0x0 && bVar3) {
        memmove((psVar1->local_application_settings).data_,(void *)__src,__n);
      }
      desc = 0x50;
      if (bVar3) {
        return true;
      }
    }
    else {
      ERR_put_error(0x10,0,0x103,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1079);
      desc = 0x2f;
    }
  }
  ssl_send_alert(ssl,2,desc);
  return false;
}

Assistant:

bool ssl_parse_serverhello_tlsext(SSL_HANDSHAKE *hs, const CBS *cbs) {
  SSL *const ssl = hs->ssl;
  int alert = SSL_AD_DECODE_ERROR;
  if (!ssl_scan_serverhello_tlsext(hs, cbs, &alert)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!ssl_check_serverhello_tlsext(hs)) {
    return false;
  }

  return true;
}